

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseDocTypeDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  internalSubsetSAXFunc p_Var3;
  xmlChar *pxVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlChar *ExternalID;
  xmlChar *local_28;
  
  local_28 = (xmlChar *)0x0;
  pxVar2 = ctxt->input;
  pxVar6 = pxVar2->cur;
  pxVar2->cur = pxVar6 + 9;
  pxVar2->col = pxVar2->col + 9;
  if (pxVar6[9] == '\0') {
    xmlParserGrow(ctxt);
  }
  iVar5 = xmlSkipBlankChars(ctxt);
  if (iVar5 == 0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "Space required after \'DOCTYPE\'\n");
  }
  pxVar6 = xmlParseName(ctxt);
  if (pxVar6 == (xmlChar *)0x0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "xmlParseDocTypeDecl : no DOCTYPE name !\n");
  }
  ctxt->intSubName = pxVar6;
  xmlSkipBlankChars(ctxt);
  pxVar7 = xmlParseExternalID(ctxt,&local_28,1);
  pxVar4 = local_28;
  if (pxVar7 != (xmlChar *)0x0 || local_28 != (xmlChar *)0x0) {
    ctxt->hasExternalSubset = 1;
  }
  ctxt->extSubURI = pxVar7;
  ctxt->extSubSystem = local_28;
  xmlSkipBlankChars(ctxt);
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
      (p_Var3 = ctxt->sax->internalSubset, p_Var3 != (internalSubsetSAXFunc)0x0)) &&
     (ctxt->disableSAX == 0)) {
    (*p_Var3)(ctxt->userData,pxVar6,pxVar4,pxVar7);
  }
  xVar1 = *ctxt->input->cur;
  if ((xVar1 != '>') && (xVar1 != '[')) {
    xmlFatalErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
    return;
  }
  return;
}

Assistant:

void
xmlParseDocTypeDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name = NULL;
    xmlChar *ExternalID = NULL;
    xmlChar *URI = NULL;

    /*
     * We know that '<!DOCTYPE' has been detected.
     */
    SKIP(9);

    if (SKIP_BLANKS == 0) {
        xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
                       "Space required after 'DOCTYPE'\n");
    }

    /*
     * Parse the DOCTYPE name.
     */
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseDocTypeDecl : no DOCTYPE name !\n");
    }
    ctxt->intSubName = name;

    SKIP_BLANKS;

    /*
     * Check for SystemID and ExternalID
     */
    URI = xmlParseExternalID(ctxt, &ExternalID, 1);

    if ((URI != NULL) || (ExternalID != NULL)) {
        ctxt->hasExternalSubset = 1;
    }
    ctxt->extSubURI = URI;
    ctxt->extSubSystem = ExternalID;

    SKIP_BLANKS;

    /*
     * Create and update the internal subset.
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->internalSubset != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->internalSubset(ctxt->userData, name, ExternalID, URI);

    if ((RAW != '[') && (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
    }
}